

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FkRequired(Parse *pParse,Table *pTab,int *aChange,int chngRowid)

{
  int iVar1;
  FKey *pFVar2;
  int in_ECX;
  FKey *in_RDX;
  Table *in_RSI;
  long *in_RDI;
  FKey *p;
  int bHaveFK;
  int eRet;
  char *in_stack_ffffffffffffffb8;
  int local_40;
  bool local_39;
  FKey *local_38;
  uint bChngRowid;
  
  local_40 = 1;
  bChngRowid = 0;
  if (((*(ulong *)(*in_RDI + 0x30) & 0x4000) != 0) && (in_RSI->eTabType == '\0')) {
    if (in_RDX == (FKey *)0x0) {
      pFVar2 = sqlite3FkReferences((Table *)0x212167);
      local_39 = true;
      if (pFVar2 == (FKey *)0x0) {
        local_39 = (in_RSI->u).tab.pFKey != (FKey *)0x0;
      }
      bChngRowid = (uint)local_39;
    }
    else {
      for (local_38 = (in_RSI->u).tab.pFKey; local_38 != (FKey *)0x0; local_38 = local_38->pNextFrom
          ) {
        iVar1 = fkChildIsModified(in_RSI,local_38,(int *)in_RDX,in_ECX);
        if (iVar1 != 0) {
          iVar1 = sqlite3_stricmp(in_stack_ffffffffffffffb8,(char *)0x2121f1);
          if (iVar1 == 0) {
            local_40 = 2;
          }
          bChngRowid = 1;
        }
      }
      for (local_38 = sqlite3FkReferences((Table *)0x212225); local_38 != (FKey *)0x0;
          local_38 = local_38->pNextTo) {
        iVar1 = fkParentIsModified(in_RSI,in_RDX,(int *)CONCAT44(in_ECX,local_40),bChngRowid);
        if (iVar1 != 0) {
          if (((*(ulong *)(*in_RDI + 0x30) & 0x800000000) == 0) && (local_38->aAction[1] != '\0')) {
            return 2;
          }
          bChngRowid = 1;
        }
      }
    }
  }
  if (bChngRowid == 0) {
    local_40 = 0;
  }
  return local_40;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkRequired(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being modified */
  int *aChange,                   /* Non-NULL for UPDATE operations */
  int chngRowid                   /* True for UPDATE that affects rowid */
){
  int eRet = 1;                   /* Value to return if bHaveFK is true */
  int bHaveFK = 0;                /* If FK processing is required */
  if( pParse->db->flags&SQLITE_ForeignKeys && IsOrdinaryTable(pTab) ){
    if( !aChange ){
      /* A DELETE operation. Foreign key processing is required if the
      ** table in question is either the child or parent table for any
      ** foreign key constraint.  */
      bHaveFK = (sqlite3FkReferences(pTab) || pTab->u.tab.pFKey);
    }else{
      /* This is an UPDATE. Foreign key processing is only required if the
      ** operation modifies one or more child or parent key columns. */
      FKey *p;

      /* Check if any child key columns are being modified. */
      for(p=pTab->u.tab.pFKey; p; p=p->pNextFrom){
        if( fkChildIsModified(pTab, p, aChange, chngRowid) ){
          if( 0==sqlite3_stricmp(pTab->zName, p->zTo) ) eRet = 2;
          bHaveFK = 1;
        }
      }

      /* Check if any parent key columns are being modified. */
      for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
        if( fkParentIsModified(pTab, p, aChange, chngRowid) ){
          if( (pParse->db->flags & SQLITE_FkNoAction)==0
           && p->aAction[1]!=OE_None
          ){
            return 2;
          }
          bHaveFK = 1;
        }
      }
    }
  }
  return bHaveFK ? eRet : 0;
}